

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

string * TellSeekRead(string *__return_storage_ptr__,string *FileName)

{
  char cVar1;
  ifstream ResultReader;
  char local_220 [520];
  
  std::ifstream::ifstream(local_220,(string *)FileName,_S_bin|_S_ate);
  cVar1 = std::istream::tellg();
  std::istream::seekg(local_220,0,0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,cVar1);
  std::istream::read(local_220,(long)(__return_storage_ptr__->_M_dataplus)._M_p);
  std::ifstream::~ifstream(local_220);
  return __return_storage_ptr__;
}

Assistant:

std::string TellSeekRead(std::string FileName)
{
    std::ifstream ResultReader(FileName, std::ios::binary|std::ios::ate);
    auto FileSize = ResultReader.tellg();
    ResultReader.seekg(std::ios::beg);
    std::string Results(FileSize,0);
    ResultReader.read(&Results[0],FileSize);
    return Results;
}